

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O3

void __thiscall
Js::FunctionExecutionStateMachine::SetFullJitThreshold
          (FunctionExecutionStateMachine *this,uint16 newFullJitThreshold,bool skipSimpleJit)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  bool bVar3;
  ExecutionMode EVar4;
  bool bVar5;
  bool bVar6;
  uint sourceContextId;
  undefined4 *puVar7;
  FunctionInfo *pFVar8;
  Type *limit;
  char *pcVar9;
  FunctionExecutionStateMachine *this_00;
  int local_44;
  int *piStack_40;
  int scale;
  anon_class_16_2_023ad54b ScaleLimit;
  
  pcVar9 = (char *)this;
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    pcVar9 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
    ;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x158,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar3) goto LAB_0077f524;
    *puVar7 = 0;
  }
  EVar4 = StateToMode((FunctionExecutionStateMachine *)pcVar9,this->executionState);
  VerifyExecutionMode(this,EVar4);
  if (EVar4 == FullJit) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x159,"(GetExecutionMode() != ExecutionMode::FullJit)",
                                "GetExecutionMode() != ExecutionMode::FullJit");
    if (!bVar3) goto LAB_0077f524;
    *puVar7 = 0;
  }
  local_44 = (uint)newFullJitThreshold - (uint)this->fullJitThreshold;
  if (this->fullJitThreshold == newFullJitThreshold) {
    VerifyExecutionModeLimits(this);
    return;
  }
  this->fullJitThreshold = newFullJitThreshold;
  piStack_40 = &local_44;
  ScaleLimit.scale = (int *)this;
  bVar3 = FunctionBody::DoSimpleJit((this->owner).ptr);
  bVar5 = FunctionBody::DoInterpreterProfile((this->owner).ptr);
  if ((bVar3) && (DAT_015a4e4c != 0)) {
    pcVar9 = (char *)&stack0xffffffffffffffc0;
    bVar6 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                      ((anon_class_16_2_023ad54b *)pcVar9,&this->simpleJitLimit);
    if (!bVar6) goto LAB_0077f22e;
    goto LAB_0077f34c;
  }
LAB_0077f22e:
  if (bVar5) {
    bVar6 = FunctionBody::DoInterpreterAutoProfile((this->owner).ptr);
    if (bVar6) {
      pcVar9 = (char *)&stack0xffffffffffffffc0;
      bVar6 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                        ((anon_class_16_2_023ad54b *)pcVar9,&this->autoProfilingInterpreter1Limit);
      if (!bVar6) {
        pcVar9 = (char *)&stack0xffffffffffffffc0;
        bVar6 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                          ((anon_class_16_2_023ad54b *)pcVar9,&this->autoProfilingInterpreter0Limit)
        ;
        if (!bVar6) goto LAB_0077f269;
      }
    }
    else {
LAB_0077f269:
      if (DAT_015a4e4c == 0) {
        pcVar9 = (char *)&stack0xffffffffffffffc0;
        bVar6 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                          ((anon_class_16_2_023ad54b *)pcVar9,&this->profilingInterpreter0Limit);
        if (!bVar6) {
          if (!bVar3) {
LAB_0077f2e6:
            limit = &this->profilingInterpreter1Limit;
            goto LAB_0077f2ea;
          }
          pcVar9 = (char *)&stack0xffffffffffffffc0;
          bVar3 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                            ((anon_class_16_2_023ad54b *)pcVar9,&this->simpleJitLimit);
          if (bVar5 && !bVar3) goto LAB_0077f2e6;
          goto LAB_0077f2f3;
        }
      }
      else {
        pcVar9 = (char *)&stack0xffffffffffffffc0;
        bVar3 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                          ((anon_class_16_2_023ad54b *)pcVar9,&this->profilingInterpreter1Limit);
        if (!bVar3) {
          limit = &this->profilingInterpreter0Limit;
          goto LAB_0077f2ea;
        }
      }
    }
  }
  else {
    pcVar9 = (char *)&stack0xffffffffffffffc0;
    bVar5 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                      ((anon_class_16_2_023ad54b *)pcVar9,&this->interpreterLimit);
    if (bVar5) goto LAB_0077f34c;
    if (bVar3 && DAT_015a4e4c == 0) {
      limit = &this->simpleJitLimit;
LAB_0077f2ea:
      pcVar9 = (char *)&stack0xffffffffffffffc0;
      bVar3 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                        ((anon_class_16_2_023ad54b *)pcVar9,limit);
LAB_0077f2f3:
      if (bVar3 != false) goto LAB_0077f34c;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    pcVar9 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
    ;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x199,"(fullyScaled)","fullyScaled");
    if (!bVar3) goto LAB_0077f524;
    *puVar7 = 0;
  }
LAB_0077f34c:
  if (local_44 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    pcVar9 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
    ;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x19a,"(scale == 0)","scale == 0");
    if (!bVar3) goto LAB_0077f524;
    *puVar7 = 0;
  }
  EVar4 = StateToMode((FunctionExecutionStateMachine *)pcVar9,this->executionState);
  this_00 = this;
  VerifyExecutionMode(this,EVar4);
  if (EVar4 != SimpleJit) {
    EVar4 = StateToMode(this_00,this->executionState);
    VerifyExecutionMode(this,EVar4);
    if (ProfilingInterpreter < EVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                  ,0x19e,"(IsInterpreterExecutionMode())",
                                  "IsInterpreterExecutionMode()");
      if (!bVar3) goto LAB_0077f524;
      *puVar7 = 0;
    }
    if ((skipSimpleJit || this->simpleJitLimit < 0x10) && this->simpleJitLimit != 0) {
      sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)(this->owner).ptr);
      pFVar1 = (this->owner).ptr;
      pFVar8 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar8 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar3) {
LAB_0077f524:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
        pFVar8 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar3 = Phases::IsEnabled((Phases *)&DAT_01599240,SimpleJitPhase,sourceContextId,
                                pFVar8->functionId);
      if (!bVar3) {
        (&this->autoProfilingInterpreter1Limit)[(ulong)(DAT_015a4e4c ^ 1) * 2] =
             (&this->autoProfilingInterpreter1Limit)[(ulong)(DAT_015a4e4c ^ 1) * 2] +
             this->simpleJitLimit;
        this->simpleJitLimit = 0;
        TryTransitionToNextInterpreterExecutionMode(this);
      }
    }
  }
  VerifyExecutionModeLimits(this);
  return;
}

Assistant:

void FunctionExecutionStateMachine::SetFullJitThreshold(const uint16 newFullJitThreshold, const bool skipSimpleJit)
    {
        Assert(initializedExecutionModeAndLimits);
        Assert(GetExecutionMode() != ExecutionMode::FullJit);

        int scale = newFullJitThreshold - fullJitThreshold;
        if (scale == 0)
        {
            VerifyExecutionModeLimits();
            return;
        }
        fullJitThreshold = newFullJitThreshold;

        const auto ScaleLimit = [&](uint16 &limit) -> bool
        {
            Assert(scale != 0);
            const int limitScale = max(-static_cast<int>(limit), scale);
            const int newLimit = limit + limitScale;
            Assert(static_cast<int>(static_cast<uint16>(newLimit)) == newLimit);
            limit = static_cast<uint16>(newLimit);
            scale -= limitScale;
            Assert(limit == 0 || scale == 0);

            if (&limit == &simpleJitLimit)
            {
                FunctionEntryPointInfo *const simpleJitEntryPointInfo = owner->GetSimpleJitEntryPointInfo();
                if (owner->GetDefaultFunctionEntryPointInfo() == simpleJitEntryPointInfo)
                {
                    Assert(GetExecutionMode() == ExecutionMode::SimpleJit);
                    const int newSimpleJitCallCount = max(0, (int)simpleJitEntryPointInfo->callsCount + limitScale);
                    Assert(static_cast<int>(static_cast<uint16>(newSimpleJitCallCount)) == newSimpleJitCallCount);
                    SetSimpleJitCallCount(static_cast<uint16>(newSimpleJitCallCount));
                }
            }

            return scale == 0;
        };

        /*
        Determine which execution mode's limit scales with the full JIT threshold, in order of preference:
        - New simple JIT
        - Auto-profiling interpreter 1
        - Auto-profiling interpreter 0
        - Interpreter
        - Profiling interpreter 0 (when using old simple JIT)
        - Old simple JIT
        - Profiling interpreter 1
        - Profiling interpreter 0 (when using new simple JIT)
        */
        const bool doSimpleJit = owner->DoSimpleJit();
        const bool doInterpreterProfile = owner->DoInterpreterProfile();
        const bool fullyScaled =
            (CONFIG_FLAG(NewSimpleJit) && doSimpleJit && ScaleLimit(simpleJitLimit)) ||
            (
                doInterpreterProfile
                ? owner->DoInterpreterAutoProfile() &&
                (ScaleLimit(autoProfilingInterpreter1Limit) || ScaleLimit(autoProfilingInterpreter0Limit))
                : ScaleLimit(interpreterLimit)
                ) ||
                (
                    CONFIG_FLAG(NewSimpleJit)
                    ? doInterpreterProfile &&
                    (ScaleLimit(profilingInterpreter1Limit) || ScaleLimit(profilingInterpreter0Limit))
                    : (doInterpreterProfile && ScaleLimit(profilingInterpreter0Limit)) ||
                    (doSimpleJit && ScaleLimit(simpleJitLimit)) ||
                    (doInterpreterProfile && ScaleLimit(profilingInterpreter1Limit))
                    );
        Assert(fullyScaled);
        Assert(scale == 0);

        if (GetExecutionMode() != ExecutionMode::SimpleJit)
        {
            Assert(IsInterpreterExecutionMode());
            if (simpleJitLimit != 0 &&
                (skipSimpleJit || simpleJitLimit < DEFAULT_CONFIG_MinSimpleJitIterations) &&
                !PHASE_FORCE(Phase::SimpleJitPhase, owner))
            {
                // Simple JIT code has not yet been generated, and was either requested to be skipped, or the limit was scaled
                // down too much. Skip simple JIT by moving any remaining iterations to an equivalent interpreter execution
                // mode.
                (CONFIG_FLAG(NewSimpleJit) ? autoProfilingInterpreter1Limit : profilingInterpreter1Limit) += simpleJitLimit;
                simpleJitLimit = 0;
                TryTransitionToNextInterpreterExecutionMode();
            }
        }

        VerifyExecutionModeLimits();
    }